

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpointingdevice.cpp
# Opt level: O2

void __thiscall
QPointingDevicePrivate::clearPassiveGrabbers
          (QPointingDevicePrivate *this,QPointerEvent *event,QEventPoint *point)

{
  QList<QPointer<QObject>_> *this_00;
  QPointingDevice *this_01;
  Data *pDVar1;
  int iVar2;
  EventPointData *pEVar3;
  iterator iVar4;
  iterator iVar5;
  QDebug *pQVar6;
  QObject *_t1;
  long in_FS_OFFSET;
  QDebug local_90;
  QDebug local_88;
  undefined1 local_80 [20];
  undefined4 uStack_6c;
  undefined4 uStack_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 local_5c;
  char *local_58;
  QDebug local_50;
  QEventPoint local_48;
  undefined1 local_40 [8];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = *(QPointingDevice **)&(this->super_QInputDevicePrivate).field_0x8;
  iVar2 = QEventPoint::id(point);
  pEVar3 = queryPointById(this,iVar2);
  if (pEVar3 == (EventPointData *)0x0) {
    local_80._16_4_ = 2;
    local_5c = 0;
    uStack_6c = 0;
    uStack_68 = 0;
    uStack_64 = 0;
    uStack_60 = 0;
    local_58 = "default";
    QMessageLogger::warning();
    pQVar6 = QDebug::operator<<(&local_50,"point is not in activePoints");
    local_48.d.d.ptr = (QExplicitlySharedDataPointer<QEventPointPrivate>)pQVar6->stream;
    *(int *)((long)local_48.d.d.ptr + 0x28) = *(int *)((long)local_48.d.d.ptr + 0x28) + 1;
    ::operator<<((Stream *)local_40,&local_48);
    QDebug::~QDebug((QDebug *)local_40);
    QDebug::~QDebug((QDebug *)&local_48);
    QDebug::~QDebug(&local_50);
  }
  else if ((pEVar3->passiveGrabbers).d.size != 0) {
    this_00 = &pEVar3->passiveGrabbers;
    QtPrivateLogging::lcPointerGrab();
    if ((((byte)QtPrivateLogging::lcPointerGrab::category.field_2.bools.enabledDebug._q_value.
                _M_base._M_i & 1) != 0) &&
       (QtPrivateLogging::lcPointerGrab(),
       ((byte)QtPrivateLogging::lcPointerGrab::category.field_2.bools.enabledDebug._q_value._M_base.
              _M_i & 1) != 0)) {
      local_80._16_4_ = 2;
      uStack_6c = 0;
      uStack_68 = 0;
      uStack_64 = 0;
      uStack_60 = 0;
      local_5c = 0;
      local_58 = QtPrivateLogging::lcPointerGrab::category.name;
      QMessageLogger::debug();
      pQVar6 = QDebug::operator<<(&local_90,&(this->super_QInputDevicePrivate).name);
      pQVar6 = QDebug::operator<<(pQVar6,"point");
      iVar2 = QEventPoint::id(point);
      pQVar6 = QDebug::operator<<(pQVar6,iVar2);
      local_88.stream = pQVar6->stream;
      (local_88.stream)->ref = (local_88.stream)->ref + 1;
      QEventPoint::state(point);
      ::operator<<((Stream *)&local_50,(State)&local_88);
      pQVar6 = QDebug::operator<<(&local_50,": clearing");
      local_80._0_8_ = pQVar6->stream;
      ((Stream *)local_80._0_8_)->ref = ((Stream *)local_80._0_8_)->ref + 1;
      ::operator<<((Stream *)(local_80 + 8),(QList<QPointer<QObject>_> *)local_80);
      QDebug::~QDebug((QDebug *)(local_80 + 8));
      QDebug::~QDebug((QDebug *)local_80);
      QDebug::~QDebug(&local_50);
      QDebug::~QDebug(&local_88);
      QDebug::~QDebug(&local_90);
    }
    iVar4 = QList<QPointer<QObject>_>::begin(this_00);
    iVar5 = QList<QPointer<QObject>_>::end(this_00);
    for (; iVar4.i != iVar5.i; iVar4.i = iVar4.i + 1) {
      pDVar1 = ((iVar4.i)->wp).d;
      local_80._16_4_ = SUB84(pDVar1,0);
      uStack_6c = (undefined4)((ulong)pDVar1 >> 0x20);
      _t1 = ((iVar4.i)->wp).value;
      uStack_68 = SUB84(_t1,0);
      uStack_64 = (undefined4)((ulong)_t1 >> 0x20);
      if (pDVar1 == (Data *)0x0) {
LAB_002e3aa3:
        _t1 = (QObject *)0x0;
      }
      else {
        LOCK();
        (pDVar1->weakref)._q_value.super___atomic_base<int>._M_i =
             (pDVar1->weakref)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
        if ((pDVar1 == (Data *)0x0) ||
           ((pDVar1->strongref)._q_value.super___atomic_base<int>._M_i == 0)) goto LAB_002e3aa3;
      }
      QPointingDevice::grabChanged(this_01,_t1,UngrabPassive,event,point);
      QWeakPointer<QObject>::~QWeakPointer((QWeakPointer<QObject> *)(local_80 + 0x10));
    }
    QList<QPointer<QObject>_>::clear(this_00);
    QList<QPointer<QObject>_>::clear(&pEVar3->passiveGrabbersContext);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QPointingDevicePrivate::clearPassiveGrabbers(const QPointerEvent *event, const QEventPoint &point)
{
    Q_Q(QPointingDevice);
    auto persistentPoint = queryPointById(point.id());
    if (!persistentPoint) {
        qWarning() << "point is not in activePoints" << point;
        return;
    }
    if (persistentPoint->passiveGrabbers.isEmpty())
        return;
    if (Q_UNLIKELY(lcPointerGrab().isDebugEnabled())) {
        qCDebug(lcPointerGrab) << name << "point" << point.id() << point.state()
                               << ": clearing" << persistentPoint->passiveGrabbers;
    }
    for (auto g : persistentPoint->passiveGrabbers)
        emit q->grabChanged(g, QPointingDevice::UngrabPassive, event, point);
    persistentPoint->passiveGrabbers.clear();
    persistentPoint->passiveGrabbersContext.clear();
}